

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  upb_MiniTableExtension *e_00;
  upb_Array *arr_00;
  _Bool _Var1;
  int iVar2;
  upb_FieldMode uVar3;
  upb_Extension *puVar4;
  upb_MiniTable *m_00;
  upb_Message *msg2_1;
  upb_Array *arr_1;
  upb_MessageValue val;
  upb_MiniTable *m2_1;
  upb_MiniTableField *f_1;
  upb_MiniTableExtension *e;
  size_t i_1;
  upb_Extension *ext;
  size_t ext_count;
  upb_Message *msg2;
  upb_MiniTable *m3;
  upb_MiniTableField *f2;
  upb_Map *map;
  upb_Array *arr;
  upb_MiniTable *m2;
  upb_MiniTableField *f;
  size_t i;
  size_t field_count;
  upb_MiniTable *m_local;
  upb_Message *msg_local;
  
  field_count = (size_t)m;
  m_local = (upb_MiniTable *)msg;
  _Var1 = upb_Message_IsFrozen(msg);
  if (!_Var1) {
    _upb_Message_ShallowFreeze_dont_copy_me__upb_internal_use_only((upb_Message *)m_local);
    iVar2 = upb_MiniTable_FieldCount((upb_MiniTable *)field_count);
    i = (size_t)iVar2;
    for (f = (upb_MiniTableField *)0x0; f < i;
        f = (upb_MiniTableField *)((long)&f->number_dont_copy_me__upb_internal_use_only + 1)) {
      m2 = (upb_MiniTable *)upb_MiniTable_GetFieldByIndex((upb_MiniTable *)field_count,(uint32_t)f);
      arr = (upb_Array *)
            upb_MiniTable_SubMessage((upb_MiniTable *)field_count,(upb_MiniTableField *)m2);
      uVar3 = _upb_MiniTableField_Mode_dont_copy_me__upb_internal_use_only((upb_MiniTableField *)m2)
      ;
      if (uVar3 == kUpb_FieldMode_Map) {
        f2 = (upb_MiniTableField *)
             upb_Message_GetMutableMap((upb_Message *)m_local,(upb_MiniTableField *)m2);
        if ((upb_Map *)f2 != (upb_Map *)0x0) {
          m3 = (upb_MiniTable *)upb_MiniTable_MapValue((upb_MiniTable *)arr);
          msg2 = (upb_Message *)
                 upb_MiniTable_SubMessage((upb_MiniTable *)arr,(upb_MiniTableField *)m3);
          upb_Map_Freeze((upb_Map *)f2,(upb_MiniTable *)msg2);
        }
      }
      else if (uVar3 == kUpb_FieldMode_Array) {
        map = (upb_Map *)
              upb_Message_GetMutableArray((upb_Message *)m_local,(upb_MiniTableField *)m2);
        if (map != (upb_Map *)0x0) {
          upb_Array_Freeze((upb_Array *)map,(upb_MiniTable *)arr);
        }
      }
      else if (((uVar3 == kUpb_FieldMode_Scalar) && (arr != (upb_Array *)0x0)) &&
              (ext_count = (size_t)upb_Message_GetMutableMessage
                                             ((upb_Message *)m_local,(upb_MiniTableField *)m2),
              (upb_Message *)ext_count != (upb_Message *)0x0)) {
        upb_Message_Freeze((upb_Message *)ext_count,(upb_MiniTable *)arr);
      }
    }
    puVar4 = _upb_Message_Getexts_dont_copy_me__upb_internal_use_only
                       ((upb_Message *)m_local,(size_t *)&ext);
    for (e = (upb_MiniTableExtension *)0x0; e < ext;
        e = (upb_MiniTableExtension *)
            ((long)&(e->field_dont_copy_me__upb_internal_use_only).
                    number_dont_copy_me__upb_internal_use_only + 1)) {
      e_00 = puVar4[(long)e].ext;
      m_00 = upb_MiniTableExtension_GetSubMessage(e_00);
      arr_00 = puVar4[(long)e].data.array_val;
      uVar3 = _upb_MiniTableField_Mode_dont_copy_me__upb_internal_use_only
                        (&e_00->field_dont_copy_me__upb_internal_use_only);
      if (uVar3 == kUpb_FieldMode_Map) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/message.c"
                      ,0x93,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
      }
      if (uVar3 == kUpb_FieldMode_Array) {
        if (arr_00 != (upb_Array *)0x0) {
          upb_Array_Freeze(arr_00,m_00);
        }
      }
      else if (((uVar3 == kUpb_FieldMode_Scalar) &&
               (_Var1 = upb_MiniTableField_IsSubMessage
                                  (&e_00->field_dont_copy_me__upb_internal_use_only), _Var1)) &&
              (arr_00 != (upb_Array *)0x0)) {
        upb_Message_Freeze((upb_Message *)arr_00,m_00);
      }
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  size_t ext_count;
  const upb_Extension* ext = UPB_PRIVATE(_upb_Message_Getexts)(msg, &ext_count);

  for (size_t i = 0; i < ext_count; i++) {
    const upb_MiniTableExtension* e = ext[i].ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &ext[i].data, sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}